

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

PropertyRecord * __thiscall
ThreadContext::AddSymbolToRegistrationMap
          (ThreadContext *this,char16 *stringKey,charcount_t stringLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  type_info *this_00;
  RecyclableData *pRVar4;
  undefined **local_58;
  HashedCharacterBuffer<char16_t> *propertyName;
  size_t local_48;
  char *local_40;
  DWORD local_38;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  EnsureSymbolRegistrationMap(this);
  local_30 = UncheckedAddPropertyId(this,stringKey,stringLength,false,true);
  if (local_30 == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x10d7,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58 = &Js::HashedCharacterBuffer<char16_t>::typeinfo;
  propertyName = (HashedCharacterBuffer<char16_t> *)0x0;
  local_48 = 0xffffffffffffffff;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
  ;
  local_38 = 0x10dd;
  alloc = Memory::Recycler::TrackAllocInfo
                    (this->recycler,(TrackAllocData *)&stack0xffffffffffffffa8);
  this_00 = (type_info *)new<Memory::Recycler>(0x10,alloc,0x38bbb2);
  Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
            ((HashedCharacterBuffer<char16_t> *)this_00,(char16_t *)(local_30 + 1),
             local_30->byteCount >> 1);
  local_58 = (undefined **)this_00;
  pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(pRVar4->symbolRegistrationMap).ptr,
             (HashedCharacterBuffer<char16_t> **)&stack0xffffffffffffffa8,&local_30);
  return local_30;
}

Assistant:

const Js::PropertyRecord* ThreadContext::AddSymbolToRegistrationMap(const char16* stringKey, charcount_t stringLength)
{
    this->EnsureSymbolRegistrationMap();

    const Js::PropertyRecord* propertyRecord = this->UncheckedAddPropertyId(stringKey, stringLength, /*bind*/false, /*isSymbol*/true);

    Assert(propertyRecord);

    // We need to support null characters in the Symbol names. For e.g. "A\0Z" is a valid symbol name and is different than "A\0Y".
    // However, as the key contains a null character we need to hash the symbol name past the null character. The default implementation terminates
    // at the null character, so we use the Js::HashedCharacterBuffer as key. We allocate the key in the recycler memory as it needs to be around
    // for the lifetime of the map.
    Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(GetRecycler(), Js::HashedCharacterBuffer<char16>, propertyRecord->GetBuffer(), propertyRecord->GetLength());
    this->recyclableData->symbolRegistrationMap->Add(propertyName, propertyRecord);

    return propertyRecord;
}